

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::BriefUnitTestResultPrinter::OnTestEnd
          (BriefUnitTestResultPrinter *this,TestInfo *test_info)

{
  bool bVar1;
  TimeInMillis local_30;
  string local_28;
  
  bVar1 = TestResult::Failed(&test_info->result_);
  if (bVar1) {
    ColoredPrintf(kRed,"[  FAILED  ] ");
    PrintTestName((test_info->test_suite_name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p
                 );
    PrintFullTestCommentIfPresent(test_info);
    if (FLAGS_gtest_print_time == '\x01') {
      local_30 = (test_info->result_).elapsed_time_;
      StreamableToString<long>(&local_28,&local_30);
      printf(" (%s ms)\n",local_28._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_28);
    }
    else {
      putchar(10);
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void BriefUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Failed()) {
    ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
    PrintTestName(test_info.test_suite_name(), test_info.name());
    PrintFullTestCommentIfPresent(test_info);

    if (GTEST_FLAG_GET(print_time)) {
      printf(" (%s ms)\n",
             internal::StreamableToString(test_info.result()->elapsed_time())
                 .c_str());
    } else {
      printf("\n");
    }
    fflush(stdout);
  }
}